

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_574b8::testScanLineWithBadAttribute(char *file)

{
  int iVar1;
  char *pcVar2;
  MultiPartInputFile *pMVar3;
  TiledInputFile f;
  InputPart ip;
  MultiPartInputFile multiin;
  InputFile in;
  TiledInputPart p;
  TiledInputFile local_50 [16];
  InputPart local_40 [8];
  MultiPartInputFile local_38 [16];
  InputFile local_28 [24];
  
  iVar1 = Imf_3_2::globalThreadCount();
  pcVar2 = file;
  Imf_3_2::InputFile::InputFile(local_28,file,iVar1);
  readScanlineThing<Imf_3_2::InputFile>(local_28,SUB81(pcVar2,0));
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_38,file,iVar1,true);
  pMVar3 = local_38;
  Imf_3_2::InputPart::InputPart(local_40,pMVar3,0);
  readScanlineThing<Imf_3_2::InputPart>(local_40,SUB81(pMVar3,0));
  checkDeepTypesFailToLoad(file);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(local_50,file,iVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0x10e,"void (anonymous namespace)::testScanLineWithBadAttribute(const char *)");
}

Assistant:

void
testScanLineWithBadAttribute (const char* file)
{
    bool caught;

    InputFile in (file);
    readScanlineThing (in, false);

    MultiPartInputFile multiin (file);
    InputPart          ip (multiin, 0);
    readScanlineThing (ip, false);

    checkDeepTypesFailToLoad (file);

    // trying to open it as a tiled file should also fail
    try
    {
        caught = false;
        TiledInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a tiled part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile multiin (file);
        TiledInputPart     p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);
}